

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

COutPoint * AddTestCoin(FastRandomContext *rng,CCoinsViewCache *coins_view)

{
  long lVar1;
  CAmount CVar2;
  COutPoint *in_RDI;
  long in_FS_OFFSET;
  Coin new_coin;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  Txid *in_stack_ffffffffffffff40;
  COutPoint *this;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff68;
  bool possible_overwrite;
  Coin *in_stack_ffffffffffffff88;
  COutPoint *in_stack_ffffffffffffff90;
  CCoinsViewCache *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  Coin::Coin((Coin *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  RandomMixin<FastRandomContext>::rand256(in_stack_ffffffffffffff68);
  transaction_identifier<false>::FromUint256
            ((uint256 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  COutPoint::COutPoint(this,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  CVar2 = RandMoney<FastRandomContext_&>
                    ((FastRandomContext *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  possible_overwrite = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,
             (size_type)((ulong)CVar2 >> 0x20),
             (uchar *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CCoinsViewCache::AddCoin
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             possible_overwrite);
  Coin::~Coin((Coin *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

COutPoint AddTestCoin(FastRandomContext& rng, CCoinsViewCache& coins_view)
{
    Coin new_coin;
    COutPoint outpoint{Txid::FromUint256(rng.rand256()), /*nIn=*/0};
    new_coin.nHeight = 1;
    new_coin.out.nValue = RandMoney(rng);
    new_coin.out.scriptPubKey.assign(uint32_t{56}, 1);
    coins_view.AddCoin(outpoint, std::move(new_coin), /*possible_overwrite=*/false);

    return outpoint;
}